

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsDiv.c
# Opt level: O0

void Abc_MfsWinSweepLeafTfo_rec(Abc_Obj_t *pObj,int nLevelLimit)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  int local_24;
  int i;
  Abc_Obj_t *pFanout;
  int nLevelLimit_local;
  Abc_Obj_t *pObj_local;
  
  iVar1 = Abc_ObjIsCo(pObj);
  if (((iVar1 == 0) && ((int)(*(uint *)&pObj->field_0x14 >> 0xc) <= nLevelLimit)) &&
     (iVar1 = Abc_NodeIsTravIdCurrent(pObj), iVar1 == 0)) {
    Abc_NodeSetTravIdCurrent(pObj);
    for (local_24 = 0; iVar1 = Abc_ObjFanoutNum(pObj), local_24 < iVar1; local_24 = local_24 + 1) {
      pObj_00 = Abc_ObjFanout(pObj,local_24);
      Abc_MfsWinSweepLeafTfo_rec(pObj_00,nLevelLimit);
    }
  }
  return;
}

Assistant:

void Abc_MfsWinSweepLeafTfo_rec( Abc_Obj_t * pObj, int nLevelLimit )
{
    Abc_Obj_t * pFanout;
    int i;
    if ( Abc_ObjIsCo(pObj) || (int)pObj->Level > nLevelLimit )
        return;
    if ( Abc_NodeIsTravIdCurrent(pObj) )
        return;
    Abc_NodeSetTravIdCurrent( pObj );
    Abc_ObjForEachFanout( pObj, pFanout, i )
        Abc_MfsWinSweepLeafTfo_rec( pFanout, nLevelLimit );
}